

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::getsockopt
          (AggregateConnectionReceiver *this,int __fd,int __level,int __optname,void *__optval,
          socklen_t *__optlen)

{
  bool bVar1;
  int iVar2;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *this_00;
  ConnectionReceiver *pCVar3;
  undefined4 in_register_0000000c;
  Fault local_70;
  Fault f;
  size_t local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  uint *length_local;
  void *value_local;
  int option_local;
  int level_local;
  AggregateConnectionReceiver *this_local;
  
  _kjCondition._32_8_ = __optval;
  local_60 = Array<kj::Own<kj::ConnectionReceiver,_std::nullptr_t>_>::size(&this->receivers);
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_50,&local_58,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xb48,FAILED,"receivers.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_50);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  this_00 = Array<kj::Own<kj::ConnectionReceiver,_std::nullptr_t>_>::operator[](&this->receivers,0);
  pCVar3 = Own<kj::ConnectionReceiver,_std::nullptr_t>::operator->(this_00);
  iVar2 = (*pCVar3->_vptr_ConnectionReceiver[3])
                    (pCVar3,(ulong)(uint)__fd,(ulong)(uint)__level,
                     CONCAT44(in_register_0000000c,__optname),_kjCondition._32_8_);
  return iVar2;
}

Assistant:

void getsockopt(int level, int option, void* value, uint* length) override {
    KJ_REQUIRE(receivers.size() > 0);
    return receivers[0]->getsockopt(level, option, value, length);
  }